

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::Joint::keyframe(Joint *this,double t)

{
  double dVar1;
  pointer ppJVar2;
  double dVar3;
  double dVar4;
  mapped_type *pmVar5;
  pointer ppJVar6;
  double local_18;
  
  dVar3 = (this->super_SceneObject).position.x;
  dVar4 = (this->super_SceneObject).position.y;
  dVar1 = (this->super_SceneObject).position.z;
  local_18 = t;
  pmVar5 = std::
           map<double,_CMU462::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
           ::operator[](&(this->super_SceneObject).positions.knots,&local_18);
  pmVar5->x = dVar3;
  pmVar5->y = dVar4;
  pmVar5->z = dVar1;
  dVar3 = (this->super_SceneObject).rotation.x;
  dVar4 = (this->super_SceneObject).rotation.y;
  dVar1 = (this->super_SceneObject).rotation.z;
  local_18 = t;
  pmVar5 = std::
           map<double,_CMU462::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
           ::operator[](&(this->super_SceneObject).rotations.knots,&local_18);
  pmVar5->x = dVar3;
  pmVar5->y = dVar4;
  pmVar5->z = dVar1;
  dVar3 = (this->super_SceneObject).scale.x;
  dVar4 = (this->super_SceneObject).scale.y;
  dVar1 = (this->super_SceneObject).scale.z;
  local_18 = t;
  pmVar5 = std::
           map<double,_CMU462::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
           ::operator[](&(this->super_SceneObject).scales.knots,&local_18);
  pmVar5->x = dVar3;
  pmVar5->y = dVar4;
  pmVar5->z = dVar1;
  ppJVar2 = (this->kids).
            super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppJVar6 = (this->kids).
                 super__Vector_base<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppJVar6 != ppJVar2;
      ppJVar6 = ppJVar6 + 1) {
    keyframe(*ppJVar6,t);
  }
  return;
}

Assistant:

void Joint::keyframe(double t) {
     positions.setValue(t, position);
     rotations.setValue(t, rotation);
     scales.setValue(t, scale);
     for (Joint *j : kids) j->keyframe(t);
   }